

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

void __thiscall ContainerToReaderWrapper::resetDelayedMark(ContainerToReaderWrapper *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  
  for (p_Var3 = (this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    p_Var1 = p_Var3[1]._M_parent;
    for (p_Var2 = p_Var1[8]._M_parent; p_Var2 != (_Rb_tree_node_base *)&p_Var1[7]._M_right;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (*(int *)&p_Var2[1].field_0x4 == 4) {
        *(undefined4 *)&p_Var2[1].field_0x4 = 0;
      }
    }
  }
  return;
}

Assistant:

void ContainerToReaderWrapper::resetDelayedMark() const
{
    for (auto& itr : m_readerInfo)
    {
        DemuxerData& demuxerData = itr.second.m_demuxerData;
        for (auto& itr2 : demuxerData.lastReadRez)
        {
            if (itr2.second == DATA_DELAYED)
                itr2.second = 0;
        }
    }
}